

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall ImGuiTabBar::ImGuiTabBar(ImGuiTabBar *this)

{
  (this->Tabs).Size = 0;
  (this->Tabs).Capacity = 0;
  (this->Tabs).Data = (ImGuiTabItem *)0x0;
  (this->BarRect).Min.x = 0.0;
  (this->BarRect).Min.y = 0.0;
  (this->BarRect).Max.x = 0.0;
  (this->BarRect).Max.y = 0.0;
  (this->FramePadding).x = 0.0;
  (this->FramePadding).y = 0.0;
  (this->BackupCursorPos).x = 0.0;
  (this->BackupCursorPos).y = 0.0;
  (this->TabsNames).Buf.Size = 0;
  (this->TabsNames).Buf.Capacity = 0;
  (this->TabsNames).Buf.Data = (char *)0x0;
  memset(this,0,0x98);
  this->CurrFrameVisible = -1;
  this->PrevFrameVisible = -1;
  this->LastTabItemIdx = -1;
  return;
}

Assistant:

ImGuiTabBar::ImGuiTabBar()
{
    memset(this, 0, sizeof(*this));
    CurrFrameVisible = PrevFrameVisible = -1;
    LastTabItemIdx = -1;
}